

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_dlmzb(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 retval;
  TCGv_ptr arg1;
  TCGv_i64 arg2;
  uint32_t uVar1;
  TCGv_i32 arg4;
  TCGv_i32 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = Rc(ctx->opcode);
  arg4 = tcg_const_i32_ppc64(tcg_ctx_00,uVar1);
  uVar1 = rA(ctx->opcode);
  retval = cpu_gpr[uVar1];
  arg1 = tcg_ctx_00->cpu_env;
  uVar1 = rS(ctx->opcode);
  arg2 = cpu_gpr[uVar1];
  uVar1 = rB(ctx->opcode);
  gen_helper_dlmzb(tcg_ctx_00,retval,arg1,arg2,cpu_gpr[uVar1],arg4);
  tcg_temp_free_i32(tcg_ctx_00,arg4);
  return;
}

Assistant:

static void gen_dlmzb(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_const_i32(tcg_ctx, Rc(ctx->opcode));
    gen_helper_dlmzb(tcg_ctx, cpu_gpr[rA(ctx->opcode)], tcg_ctx->cpu_env,
                     cpu_gpr[rS(ctx->opcode)], cpu_gpr[rB(ctx->opcode)], t0);
    tcg_temp_free_i32(tcg_ctx, t0);
}